

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  Mat4x4 prod;
  Mat4x4 tm;
  _Mat4x4 local_228;
  Mat4x4 local_1a0;
  Mat4x4 local_120;
  Mat4x4 local_a0;
  
  local_228.d[0][0] = 11.0;
  local_228.d[0][1] = 10.0;
  local_228.d[0][2] = 4.0;
  local_228.d[0][3] = 6.0;
  local_228.d[1][0] = 9.0;
  local_228.d[1][1] = 8.0;
  local_228.d[1][2] = 7.0;
  local_228.d[1][3] = 12.0;
  local_228.d[2][0] = 13.0;
  local_228.d[2][1] = 14.0;
  local_228.d[2][2] = 15.0;
  local_228.d[2][3] = 16.0;
  local_228.d[3][0] = 17.0;
  local_228.d[3][1] = 3.0;
  local_228.d[3][2] = 5.0;
  local_228.d[3][3] = 18.0;
  std::operator<<((ostream *)&std::cout,"M:\n");
  poVar2 = phyr::operator<<((ostream *)&std::cout,&local_228);
  std::endl<char,std::char_traits<char>>(poVar2);
  phyr::_Mat4x4::inverse(&local_a0,&local_228);
  std::operator<<((ostream *)&std::cout,"\nInverse M:\n");
  poVar2 = phyr::operator<<((ostream *)&std::cout,&local_a0);
  std::endl<char,std::char_traits<char>>(poVar2);
  phyr::_Mat4x4::operator*(&local_228,&local_a0);
  std::operator<<((ostream *)&std::cout,"\nProduct:\n");
  *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) =
       *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  poVar2 = phyr::operator<<((ostream *)&std::cout,&local_120);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_1a0.d[3][3] = 1.0;
  local_1a0.d[2][2] = 1.0;
  local_1a0.d[1][1] = 1.0;
  local_1a0.d[0][0] = 1.0;
  local_1a0.d[0][1] = 0.0;
  local_1a0.d[0][2] = 0.0;
  local_1a0.d[0][3] = 0.0;
  local_1a0.d[1][0] = 0.0;
  local_1a0.d[1][2] = 0.0;
  local_1a0.d[1][3] = 0.0;
  local_1a0.d[2][0] = 0.0;
  local_1a0.d[2][1] = 0.0;
  local_1a0.d[2][3] = 0.0;
  local_1a0.d[3][0] = 0.0;
  local_1a0.d[3][1] = 0.0;
  local_1a0.d[3][2] = 0.0;
  bVar1 = phyr::_Mat4x4::operator==(&local_228,&local_1a0);
  return (int)!bVar1;
}

Assistant:

int main(int argc, const char* argv[]) {
    phyr::Mat4x4 m(11, 10, 4, 6, 9, 8, 7, 12,
                   13, 14, 15, 16, 17, 3, 5, 18);
    std::cout << "M:\n";
    std::cout << m << std::endl;

    phyr::Mat4x4 tm = phyr::Mat4x4::inverse(m);
    std::cout << "\nInverse M:\n";
    std::cout << tm << std::endl;

    phyr::Mat4x4 prod = m * tm;
    std::cout << "\nProduct:\n";
    std::cout << std::fixed << prod << std::endl;

    return m == phyr::Mat4x4() ? 0 : 1;
}